

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2mem.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 *in_RSI;
  int in_EDI;
  char *in_stack_00000028;
  char *in_stack_00000030;
  char *in_stack_00000038;
  string parambinpath;
  char *name;
  char *lastslash;
  char *memcpppath;
  char *idcpppath;
  char *modelpath;
  char *parampath;
  char *in_stack_00000488;
  char *in_stack_00000490;
  char *in_stack_00000498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *local_a0;
  allocator<char> local_81;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  string local_60 [32];
  char *local_40;
  char *local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  char *local_18;
  int local_4;
  
  local_4 = 0;
  if (in_EDI == 5) {
    local_18 = (char *)in_RSI[1];
    local_20 = in_RSI[2];
    local_28 = in_RSI[3];
    local_30 = in_RSI[4];
    local_38 = strrchr(local_18,0x2f);
    if (local_38 == (char *)0x0) {
      local_a0 = local_18;
    }
    else {
      local_a0 = local_38 + 1;
    }
    local_40 = local_a0;
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::operator+(__lhs,local_a0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    std::allocator<char>::~allocator(&local_81);
    std::__cxx11::string::c_str();
    dump_param(in_stack_00000498,in_stack_00000490,in_stack_00000488);
    std::__cxx11::string::c_str();
    write_memcpp(in_stack_00000038,in_stack_00000030,in_stack_00000028);
    local_4 = 0;
    std::__cxx11::string::~string(local_60);
  }
  else {
    fprintf(_stderr,"Usage: %s [ncnnproto] [ncnnbin] [idcpppath] [memcpppath]\n",*in_RSI);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 5)
    {
        fprintf(stderr, "Usage: %s [ncnnproto] [ncnnbin] [idcpppath] [memcpppath]\n", argv[0]);
        return -1;
    }

    const char* parampath = argv[1];
    const char* modelpath = argv[2];
    const char* idcpppath = argv[3];
    const char* memcpppath = argv[4];

    const char* lastslash = strrchr(parampath, '/');
    const char* name = lastslash == NULL ? parampath : lastslash + 1;

    std::string parambinpath = std::string(name) + ".bin";

    dump_param(parampath, parambinpath.c_str(), idcpppath);

    write_memcpp(parambinpath.c_str(), modelpath, memcpppath);

    return 0;
}